

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O2

string * llama_model_ftype_name_abi_cxx11_(string *__return_storage_ptr__,llama_ftype ftype)

{
  char *__s;
  string local_30;
  
  if ((ftype >> 10 & 1) == 0) {
    switch(ftype) {
    case LLAMA_FTYPE_ALL_F32:
      __s = "all F32";
      break;
    case LLAMA_FTYPE_MOSTLY_F16:
      __s = "F16";
      break;
    case LLAMA_FTYPE_MOSTLY_Q4_0:
      __s = "Q4_0";
      break;
    case LLAMA_FTYPE_MOSTLY_Q4_1:
      __s = "Q4_1";
      break;
    default:
      __s = "unknown, may not work";
      break;
    case LLAMA_FTYPE_MOSTLY_Q8_0:
      __s = "Q8_0";
      break;
    case LLAMA_FTYPE_MOSTLY_Q5_0:
      __s = "Q5_0";
      break;
    case LLAMA_FTYPE_MOSTLY_Q5_1:
      __s = "Q5_1";
      break;
    case LLAMA_FTYPE_MOSTLY_Q2_K:
      __s = "Q2_K - Medium";
      break;
    case LLAMA_FTYPE_MOSTLY_Q3_K_S:
      __s = "Q3_K - Small";
      break;
    case LLAMA_FTYPE_MOSTLY_Q3_K_M:
      __s = "Q3_K - Medium";
      break;
    case LLAMA_FTYPE_MOSTLY_Q3_K_L:
      __s = "Q3_K - Large";
      break;
    case LLAMA_FTYPE_MOSTLY_Q4_K_S:
      __s = "Q4_K - Small";
      break;
    case LLAMA_FTYPE_MOSTLY_Q4_K_M:
      __s = "Q4_K - Medium";
      break;
    case LLAMA_FTYPE_MOSTLY_Q5_K_S:
      __s = "Q5_K - Small";
      break;
    case LLAMA_FTYPE_MOSTLY_Q5_K_M:
      __s = "Q5_K - Medium";
      break;
    case LLAMA_FTYPE_MOSTLY_Q6_K:
      __s = "Q6_K";
      break;
    case LLAMA_FTYPE_MOSTLY_IQ2_XXS:
      __s = "IQ2_XXS - 2.0625 bpw";
      break;
    case LLAMA_FTYPE_MOSTLY_IQ2_XS:
      __s = "IQ2_XS - 2.3125 bpw";
      break;
    case LLAMA_FTYPE_MOSTLY_Q2_K_S:
      __s = "Q2_K - Small";
      break;
    case LLAMA_FTYPE_MOSTLY_IQ3_XS:
      __s = "IQ3_XS - 3.3 bpw";
      break;
    case LLAMA_FTYPE_MOSTLY_IQ3_XXS:
      __s = "IQ3_XXS - 3.0625 bpw";
      break;
    case LLAMA_FTYPE_MOSTLY_IQ1_S:
      __s = "IQ1_S - 1.5625 bpw";
      break;
    case LLAMA_FTYPE_MOSTLY_IQ4_NL:
      __s = "IQ4_NL - 4.5 bpw";
      break;
    case LLAMA_FTYPE_MOSTLY_IQ3_S:
      __s = "IQ3_S - 3.4375 bpw";
      break;
    case LLAMA_FTYPE_MOSTLY_IQ3_M:
      __s = "IQ3_S mix - 3.66 bpw";
      break;
    case LLAMA_FTYPE_MOSTLY_IQ2_S:
      __s = "IQ2_S - 2.5 bpw";
      break;
    case LLAMA_FTYPE_MOSTLY_IQ2_M:
      __s = "IQ2_M - 2.7 bpw";
      break;
    case LLAMA_FTYPE_MOSTLY_IQ4_XS:
      __s = "IQ4_XS - 4.25 bpw";
      break;
    case LLAMA_FTYPE_MOSTLY_IQ1_M:
      __s = "IQ1_M - 1.75 bpw";
      break;
    case LLAMA_FTYPE_MOSTLY_BF16:
      __s = "BF16";
      break;
    case LLAMA_FTYPE_MOSTLY_TQ1_0:
      __s = "TQ1_0 - 1.69 bpw ternary";
      break;
    case LLAMA_FTYPE_MOSTLY_TQ2_0:
      __s = "TQ2_0 - 2.06 bpw ternary";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_30);
  }
  else {
    llama_model_ftype_name_abi_cxx11_(&local_30,ftype & ~LLAMA_FTYPE_GUESSED);
    std::operator+(__return_storage_ptr__,&local_30," (guessed)");
    std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string llama_model_ftype_name(llama_ftype ftype) {
    if (ftype & LLAMA_FTYPE_GUESSED) {
        return llama_model_ftype_name((enum llama_ftype) (ftype & ~LLAMA_FTYPE_GUESSED)) + " (guessed)";
    }

    switch (ftype) {
        case LLAMA_FTYPE_ALL_F32:         return "all F32";
        case LLAMA_FTYPE_MOSTLY_F16:      return "F16";
        case LLAMA_FTYPE_MOSTLY_BF16:     return "BF16";
        case LLAMA_FTYPE_MOSTLY_Q4_0:     return "Q4_0";
        case LLAMA_FTYPE_MOSTLY_Q4_1:     return "Q4_1";
        case LLAMA_FTYPE_MOSTLY_Q5_0:     return "Q5_0";
        case LLAMA_FTYPE_MOSTLY_Q5_1:     return "Q5_1";
        case LLAMA_FTYPE_MOSTLY_Q8_0:     return "Q8_0";
        case LLAMA_FTYPE_MOSTLY_Q2_K:     return "Q2_K - Medium";
        case LLAMA_FTYPE_MOSTLY_Q2_K_S:   return "Q2_K - Small";
        case LLAMA_FTYPE_MOSTLY_Q3_K_S:   return "Q3_K - Small";
        case LLAMA_FTYPE_MOSTLY_Q3_K_M:   return "Q3_K - Medium";
        case LLAMA_FTYPE_MOSTLY_Q3_K_L:   return "Q3_K - Large";
        case LLAMA_FTYPE_MOSTLY_Q4_K_S:   return "Q4_K - Small";
        case LLAMA_FTYPE_MOSTLY_Q4_K_M:   return "Q4_K - Medium";
        case LLAMA_FTYPE_MOSTLY_Q5_K_S:   return "Q5_K - Small";
        case LLAMA_FTYPE_MOSTLY_Q5_K_M:   return "Q5_K - Medium";
        case LLAMA_FTYPE_MOSTLY_Q6_K:     return "Q6_K";
        case LLAMA_FTYPE_MOSTLY_TQ1_0:    return "TQ1_0 - 1.69 bpw ternary";
        case LLAMA_FTYPE_MOSTLY_TQ2_0:    return "TQ2_0 - 2.06 bpw ternary";
        case LLAMA_FTYPE_MOSTLY_IQ2_XXS:  return "IQ2_XXS - 2.0625 bpw";
        case LLAMA_FTYPE_MOSTLY_IQ2_XS:   return "IQ2_XS - 2.3125 bpw";
        case LLAMA_FTYPE_MOSTLY_IQ2_S:    return "IQ2_S - 2.5 bpw";
        case LLAMA_FTYPE_MOSTLY_IQ2_M:    return "IQ2_M - 2.7 bpw";
        case LLAMA_FTYPE_MOSTLY_IQ3_XS:   return "IQ3_XS - 3.3 bpw";
        case LLAMA_FTYPE_MOSTLY_IQ3_XXS:  return "IQ3_XXS - 3.0625 bpw";
        case LLAMA_FTYPE_MOSTLY_IQ1_S:    return "IQ1_S - 1.5625 bpw";
        case LLAMA_FTYPE_MOSTLY_IQ1_M:    return "IQ1_M - 1.75 bpw";
        case LLAMA_FTYPE_MOSTLY_IQ4_NL:   return "IQ4_NL - 4.5 bpw";
        case LLAMA_FTYPE_MOSTLY_IQ4_XS:   return "IQ4_XS - 4.25 bpw";
        case LLAMA_FTYPE_MOSTLY_IQ3_S:    return "IQ3_S - 3.4375 bpw";
        case LLAMA_FTYPE_MOSTLY_IQ3_M:    return "IQ3_S mix - 3.66 bpw";

        default: return "unknown, may not work";
    }
}